

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O0

void __thiscall
ExhaustiveLightSampling_PdfMethod_Test::~ExhaustiveLightSampling_PdfMethod_Test
          (ExhaustiveLightSampling_PdfMethod_Test *this)

{
  void *in_RDI;
  
  ~ExhaustiveLightSampling_PdfMethod_Test((ExhaustiveLightSampling_PdfMethod_Test *)0x531638);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ExhaustiveLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    ExhaustiveLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight =
            distrib.Sample(intr, rng.Uniform<Float>());
        ASSERT_TRUE((bool)sampledLight) << i << " - " << p;
        EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}